

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::applyTransparencySettings(GLEngine *this)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(this->super_Engine).transparencyMode;
  if (uVar2 < 3) {
    uVar1 = *(uint *)(&DAT_005271c4 + uVar2 * 4);
    (*(this->super_Engine)._vptr_Engine[0xb])(this,(ulong)*(uint *)(&DAT_005271b8 + uVar2 * 4));
    (*(this->super_Engine)._vptr_Engine[10])(this,(ulong)uVar1);
    return;
  }
  return;
}

Assistant:

void GLEngine::applyTransparencySettings() {
  // Remove any old transparency-related rules
  switch (transparencyMode) {
  case TransparencyMode::None: {
    setBlendMode(BlendMode::AlphaOver);
    setDepthMode(DepthMode::Less);
    break;
  }
  case TransparencyMode::Simple: {
    setBlendMode(BlendMode::Add);
    setDepthMode(DepthMode::Disable);
    break;
  }
  case TransparencyMode::Pretty: {
    setBlendMode(BlendMode::Disable);
    setDepthMode(DepthMode::Less);
    break;
  }
  }
}